

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

uint compute_motion_cost(MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                        BLOCK_SIZE bsize,MV *this_mv)

{
  buf_2d *pbVar1;
  uint uVar2;
  int iVar3;
  uint sse;
  uint local_24;
  
  av1_enc_build_inter_predictor(cm,xd,xd->mi_row,xd->mi_col,(BUFFER_SET *)0x0,bsize,0,0);
  pbVar1 = (ms_params->var_params).ms_buffers.src;
  uVar2 = (*((ms_params->var_params).vfp)->vf)
                    (xd->plane[0].dst.buf,xd->plane[0].dst.stride,pbVar1->buf,pbVar1->stride,
                     &local_24);
  iVar3 = mv_err_cost_(this_mv,&ms_params->mv_cost_params);
  return iVar3 + uVar2;
}

Assistant:

static inline unsigned int compute_motion_cost(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, BLOCK_SIZE bsize,
    const MV *this_mv) {
  unsigned int mse;
  unsigned int sse;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                AOM_PLANE_Y, AOM_PLANE_Y);

  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const MSBuffers *ms_buffers = &var_params->ms_buffers;

  const uint8_t *const src = ms_buffers->src->buf;
  const int src_stride = ms_buffers->src->stride;
  const uint8_t *const dst = xd->plane[0].dst.buf;
  const int dst_stride = xd->plane[0].dst.stride;
  const aom_variance_fn_ptr_t *vfp = ms_params->var_params.vfp;

  mse = vfp->vf(dst, dst_stride, src, src_stride, &sse);
  mse += mv_err_cost_(this_mv, &ms_params->mv_cost_params);
  return mse;
}